

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::prepare_int_buffer<fmt::AlignSpec>
          (BasicWriter<wchar_t> *this,uint num_digits,AlignSpec *spec,char *prefix,uint prefix_size)

{
  uint total_size;
  wchar_t fill;
  Alignment AVar1;
  undefined8 *puVar2;
  CharPtr pwVar3;
  CharPtr pwVar4;
  long lVar5;
  wchar_t __tmp;
  uint uVar6;
  ulong uVar7;
  AlignSpec subspec;
  AlignSpec local_3c;
  
  total_size = (spec->super_WidthSpec).width_;
  uVar7 = (ulong)total_size;
  fill = (spec->super_WidthSpec).fill_;
  AVar1 = spec->align_;
  if ((int)num_digits < -1) {
    if (prefix_size == 0) {
      prefix_size = 0;
    }
    else if (prefix[prefix_size - 1] == '0') {
      prefix_size = prefix_size - 1;
    }
    uVar6 = prefix_size - 1;
    local_3c.super_WidthSpec.fill_ = L'0';
    local_3c.align_ = ALIGN_NUMERIC;
    local_3c.super_WidthSpec.width_ = uVar6;
    if (uVar6 < total_size) {
      puVar2 = *(undefined8 **)(this + 8);
      if ((ulong)puVar2[3] < uVar7) {
        (**(code **)*puVar2)(puVar2,uVar7);
      }
      uVar7 = (ulong)(total_size - uVar6);
      if (AVar1 != ALIGN_LEFT) {
        pwVar3 = grow_buffer(this,uVar7);
        for (lVar5 = 0; uVar7 * 4 - lVar5 != 0; lVar5 = lVar5 + 4) {
          *(wchar_t *)((long)pwVar3 + lVar5) = fill;
        }
      }
      pwVar3 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_3c,prefix,prefix_size);
      if (AVar1 != ALIGN_LEFT) {
        return pwVar3;
      }
      pwVar4 = grow_buffer(this,uVar7);
      for (lVar5 = 0; uVar7 << 2 != lVar5; lVar5 = lVar5 + 4) {
        *(wchar_t *)((long)pwVar4 + lVar5) = fill;
      }
      return pwVar3;
    }
    pwVar3 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_3c,prefix,prefix_size);
    return pwVar3;
  }
  uVar6 = prefix_size + num_digits;
  if (total_size <= uVar6) {
    pwVar3 = grow_buffer(this,(ulong)uVar6);
    std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<char_const*,wchar_t*>
              (prefix,prefix + prefix_size,pwVar3);
    pwVar3 = pwVar3 + uVar6;
    goto LAB_00139531;
  }
  pwVar4 = grow_buffer(this,uVar7);
  pwVar3 = pwVar4 + uVar7;
  if (AVar1 == ALIGN_NUMERIC) {
    if (prefix_size != 0) {
      pwVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char_const*,wchar_t*>(prefix,prefix + prefix_size,pwVar4);
      uVar6 = num_digits;
    }
  }
  else {
    if (AVar1 == ALIGN_CENTER) {
      pwVar3 = fill_padding(pwVar4,total_size,(ulong)uVar6,fill);
      std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<char_const*,wchar_t*>
                (prefix,prefix + prefix_size,pwVar3);
      pwVar3 = pwVar3 + uVar6;
      goto LAB_00139531;
    }
    if (AVar1 == ALIGN_LEFT) {
      std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<char_const*,wchar_t*>
                (prefix,prefix + prefix_size,pwVar4);
      pwVar3 = pwVar4 + uVar6;
      for (lVar5 = (ulong)uVar6 << 2; uVar7 << 2 != lVar5; lVar5 = lVar5 + 4) {
        *(wchar_t *)((long)pwVar4 + lVar5) = fill;
      }
      goto LAB_00139531;
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<char_const*,wchar_t*>
              (prefix,prefix + prefix_size,pwVar3 + -(ulong)uVar6);
  }
  for (; pwVar4 != pwVar3 + -(ulong)uVar6; pwVar4 = pwVar4 + 1) {
    *pwVar4 = fill;
  }
LAB_00139531:
  return pwVar3 + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}